

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_color nk_hsva_f(float h,float s,float v,float a)

{
  nk_color nVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float b;
  float fVar6;
  
  if (0.0 < s) {
    fVar5 = h / 0.16666667;
    b = (1.0 - s) * v;
    fVar6 = (1.0 - (1.0 - (fVar5 - (float)(int)fVar5)) * s) * v;
    fVar3 = v;
    fVar4 = fVar6;
    if ((int)fVar5 - 1U < 5) {
      fVar2 = (1.0 - s * (fVar5 - (float)(int)fVar5)) * v;
      fVar3 = b;
      fVar4 = b;
      switch((int)fVar5) {
      case 1:
        fVar3 = fVar2;
        fVar4 = v;
        break;
      case 2:
        fVar4 = v;
        b = fVar6;
        break;
      case 3:
        fVar4 = fVar2;
        b = v;
        break;
      case 4:
        fVar3 = fVar6;
        b = v;
        break;
      case 5:
        fVar3 = v;
        b = fVar2;
      }
    }
    nVar1 = nk_rgba_f(fVar3,fVar4,b,a);
    return nVar1;
  }
  nVar1 = nk_rgb_f(v,v,v);
  return nVar1;
}

Assistant:

NK_API struct nk_color
nk_hsva_f(float h, float s, float v, float a)
{
    struct nk_colorf out = {0,0,0,0};
    float p, q, t, f;
    int i;

    if (s <= 0.0f) {
        out.r = v; out.g = v; out.b = v;
        return nk_rgb_f(out.r, out.g, out.b);
    }

    h = h / (60.0f/360.0f);
    i = (int)h;
    f = h - (float)i;
    p = v * (1.0f - s);
    q = v * (1.0f - (s * f));
    t = v * (1.0f - s * (1.0f - f));

    switch (i) {
    case 0: default: out.r = v; out.g = t; out.b = p; break;
    case 1: out.r = q; out.g = v; out.b = p; break;
    case 2: out.r = p; out.g = v; out.b = t; break;
    case 3: out.r = p; out.g = q; out.b = v; break;
    case 4: out.r = t; out.g = p; out.b = v; break;
    case 5: out.r = v; out.g = p; out.b = q; break;
    }
    return nk_rgba_f(out.r, out.g, out.b, a);
}